

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::anon_unknown_105::ReadStringNoArena
                 (MessageLite *param_1,char *ptr,ParseContext *ctx,uint32_t param_4,
                 TcParseTableBase *param_5,ArenaStringPtr *field)

{
  byte bVar1;
  string *s;
  char *pcVar2;
  uint size;
  pair<const_char_*,_int> pVar3;
  
  bVar1 = *(byte *)&param_1->_vptr_MessageLite;
  size = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    pVar3 = ReadSizeFallback((char *)param_1,(uint)bVar1);
    pcVar2 = pVar3.first;
    size = pVar3.second;
  }
  else {
    pcVar2 = (char *)((long)&param_1->_vptr_MessageLite + 1);
  }
  if (pcVar2 != (char *)0x0) {
    s = ArenaStringPtr::MutableNoCopy_abi_cxx11_((ArenaStringPtr *)ctx,(Arena *)0x0);
    pcVar2 = EpsCopyInputStream::ReadString((EpsCopyInputStream *)ptr,pcVar2,size,s);
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

PROTOBUF_NOINLINE
const char* ReadStringNoArena(MessageLite* /*msg*/, const char* ptr,
                              ParseContext* ctx, uint32_t /*aux_idx*/,
                              const TcParseTableBase* /*table*/,
                              ArenaStringPtr& field) {
  int size = ReadSize(&ptr);
  if (!ptr) return nullptr;
  return ctx->ReadString(ptr, size, field.MutableNoCopy(nullptr));
}